

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void setup_buffer_pool(AV1_COMMON *cm)

{
  pthread_mutex_t *__mutex;
  SequenceHeader *pSVar1;
  RefCntBuffer *pRVar2;
  aom_transfer_characteristics_t aVar3;
  int iVar4;
  
  __mutex = (pthread_mutex_t *)cm->buffer_pool;
  pSVar1 = cm->seq_params;
  pthread_mutex_lock(__mutex);
  iVar4 = aom_realloc_frame_buffer
                    (&cm->cur_frame->buf,cm->width,cm->height,pSVar1->subsampling_x,
                     pSVar1->subsampling_y,(uint)pSVar1->use_highbitdepth,0x40,
                     (cm->features).byte_alignment,&cm->cur_frame->raw_frame_buffer,
                     *(aom_get_frame_buffer_cb_fn_t *)((long)__mutex + 0x30),
                     (void *)__mutex[1].__align,false,0);
  if (iVar4 != 0) {
    pthread_mutex_unlock(__mutex);
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate frame buffer");
  }
  pthread_mutex_unlock(__mutex);
  pRVar2 = cm->cur_frame;
  (pRVar2->buf).bit_depth = pSVar1->bit_depth;
  aVar3 = pSVar1->transfer_characteristics;
  (pRVar2->buf).color_primaries = pSVar1->color_primaries;
  (pRVar2->buf).transfer_characteristics = aVar3;
  (pRVar2->buf).matrix_coefficients = pSVar1->matrix_coefficients;
  (pRVar2->buf).monochrome = pSVar1->monochrome;
  (pRVar2->buf).chroma_sample_position = pSVar1->chroma_sample_position;
  (pRVar2->buf).color_range = pSVar1->color_range;
  iVar4 = cm->render_height;
  (pRVar2->buf).render_width = cm->render_width;
  (pRVar2->buf).render_height = iVar4;
  return;
}

Assistant:

static inline void setup_buffer_pool(AV1_COMMON *cm) {
  BufferPool *const pool = cm->buffer_pool;
  const SequenceHeader *const seq_params = cm->seq_params;

  lock_buffer_pool(pool);
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          AOM_DEC_BORDER_IN_PIXELS, cm->features.byte_alignment,
          &cm->cur_frame->raw_frame_buffer, pool->get_fb_cb, pool->cb_priv,
          false, 0)) {
    unlock_buffer_pool(pool);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  }
  unlock_buffer_pool(pool);

  cm->cur_frame->buf.bit_depth = (unsigned int)seq_params->bit_depth;
  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;
}